

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O2

void vera::extractVertexData
               (uint32_t v_pos,uint8_t *base,int accesor_componentType,int accesor_type,
               bool accesor_normalized,uint32_t byteStride,float *output,uint8_t max_num_comp)

{
  uint __line;
  ulong uVar1;
  long lVar2;
  char *__assertion;
  long lStack_20;
  float v [4];
  
  v[0] = 0.0;
  v[1] = 0.0;
  v[2] = 0.0;
  v[3] = 0.0;
  if (accesor_type == 0x41) {
    lStack_20 = 1;
  }
  else if (accesor_type == 3) {
    lStack_20 = 3;
  }
  else if (accesor_type == 4) {
    lStack_20 = 4;
  }
  else {
    if (accesor_type != 2) {
      __assertion = "!\"invalid type\"";
      __line = 0x70;
      goto LAB_0028340d;
    }
    lStack_20 = 2;
  }
  if (accesor_componentType == 0x1406) {
    for (lVar2 = 0; lStack_20 != lVar2; lVar2 = lVar2 + 1) {
      v[lVar2] = *(float *)(base + lVar2 * 4 + (ulong)(byteStride * v_pos));
    }
    for (uVar1 = 0; max_num_comp != uVar1; uVar1 = uVar1 + 1) {
      output[uVar1] = v[uVar1];
    }
    return;
  }
  __assertion = "!\"Conversion Type from float to -> ??? not implemented yet\"";
  __line = 0x7c;
LAB_0028340d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/src/io/gltf.cpp"
                ,__line,
                "void vera::extractVertexData(uint32_t, const uint8_t *, int, int, bool, uint32_t, float *, uint8_t)"
               );
}

Assistant:

void extractVertexData(uint32_t v_pos, const uint8_t *base, int accesor_componentType, int accesor_type, bool accesor_normalized, uint32_t byteStride, float *output, uint8_t max_num_comp) {
    float v[4] = {0.0f, 0.0f, 0.0f, 0.0f};
    uint32_t ncomp = 1;
    switch (accesor_type) {
        case TINYGLTF_TYPE_SCALAR: ncomp = 1; break;
        case TINYGLTF_TYPE_VEC2:   ncomp = 2; break;
        case TINYGLTF_TYPE_VEC3:   ncomp = 3; break;
        case TINYGLTF_TYPE_VEC4:   ncomp = 4; break;
        default:
            assert(!"invalid type");
    }
    switch (accesor_componentType) {
        case TINYGLTF_COMPONENT_TYPE_FLOAT: {
            const float *data = (float*)(base+byteStride*v_pos);
            for (uint32_t i = 0; (i < ncomp); ++i) {
                v[i] = data[i];
            }
        }
        // TODO SUPPORT OTHER FORMATS
        break;
        default:
            assert(!"Conversion Type from float to -> ??? not implemented yet");
            break;
    }
    for (uint32_t i = 0; i < max_num_comp; ++i) {
        output[i] = v[i];
    }
}